

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult *
iutest::internal::CmpHelperFloatingPointEQ<long_double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,longdouble val1,
          longdouble val2)

{
  bool bVar1;
  floating_point<long_double> *v;
  floating_point<long_double> *v_00;
  FInt local_c8;
  FInt local_b8;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_b8.iv._10_6_ = 0;
  local_b8.iv._0_8_ = SUB108(val1,0);
  local_b8.iv._8_2_ = (undefined2)((unkuint10)val1 >> 0x40);
  local_c8.iv._10_6_ = 0;
  local_c8.iv._0_8_ = SUB108(val2,0);
  local_c8.iv._8_2_ = (undefined2)((unkuint10)val2 >> 0x40);
  bVar1 = floating_point<long_double>::AlmostEquals
                    ((floating_point<long_double> *)&local_b8,(_Myt *)&local_c8);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    PrintToString<iutest::floating_point<long_double>>(&local_40,(iutest *)&local_b8,v);
    detail::ShowStringQuoted(&local_60,&local_40);
    PrintToString<iutest::floating_point<long_double>>(&local_a0,(iutest *)&local_c8,v_00);
    detail::ShowStringQuoted(&local_80,&local_a0);
    EqFailure(__return_storage_ptr__,expr1,expr2,&local_60,&local_80,false);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperFloatingPointEQ(const char* expr1, const char* expr2
                                                , RawType val1, RawType val2)
{
    floating_point<RawType> f1(val1), f2(val2);
    if IUTEST_COND_LIKELY( f1.AlmostEquals(f2) )
    {
        return AssertionSuccess();
    }